

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::parse_double_float(char *str,int n,bool isfloat,void *dest)

{
  int *piVar1;
  float fVar2;
  double local_108;
  double r;
  char *end;
  char buf [201];
  void *dest_local;
  bool isfloat_local;
  char *pcStack_18;
  int n_local;
  char *str_local;
  
  if (n == 0) {
    str_local._7_1_ = false;
  }
  else {
    unique0x100000af = (double *)dest;
    dest_local._3_1_ = isfloat;
    dest_local._4_4_ = n;
    pcStack_18 = str;
    pcStack_18 = TerminateNumber((char *)&end,0xc9,str,(int *)((long)&dest_local + 4),true);
    piVar1 = __errno_location();
    *piVar1 = 0;
    if ((dest_local._3_1_ & 1) == 0) {
      local_108 = strtod(pcStack_18,(char **)&r);
    }
    else {
      fVar2 = strtof(pcStack_18,(char **)&r);
      local_108 = (double)fVar2;
    }
    if ((char *)r == pcStack_18 + dest_local._4_4_) {
      piVar1 = __errno_location();
      if (*piVar1 == 0) {
        if (stack0xffffffffffffffd8 == (double *)0x0) {
          str_local._7_1_ = true;
        }
        else {
          if ((dest_local._3_1_ & 1) == 0) {
            *stack0xffffffffffffffd8 = local_108;
          }
          else {
            *(float *)stack0xffffffffffffffd8 = (float)local_108;
          }
          str_local._7_1_ = true;
        }
      }
      else {
        str_local._7_1_ = false;
      }
    }
    else {
      str_local._7_1_ = false;
    }
  }
  return str_local._7_1_;
}

Assistant:

static bool parse_double_float(const char* str, int n, bool isfloat, void *dest) {
  if (n == 0) return false;
  static const int kMaxLength = 200;
  char buf[kMaxLength+1];
  str = TerminateNumber(buf, sizeof buf, str, &n, true);
  char* end;
  errno = 0;
  double r;
  if (isfloat) {
    r = strtof(str, &end);
  } else {
    r = strtod(str, &end);
  }
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  if (isfloat) {
    *(reinterpret_cast<float*>(dest)) = (float)r;
  } else {
    *(reinterpret_cast<double*>(dest)) = r;
  }
  return true;
}